

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bz2_stream.cpp
# Opt level: O0

void __thiscall minibag::BZ2Stream::startWrite(BZ2Stream *this)

{
  _func_int **pp_Var1;
  BagException *this_00;
  Stream *in_RDI;
  string *in_stack_ffffffffffffff98;
  uint *in_stack_ffffffffffffffa0;
  uint *in_stack_ffffffffffffffa8;
  FILE *f;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  f = (FILE *)&in_RDI[2].file_;
  Stream::getFilePointer(in_RDI);
  pp_Var1 = (_func_int **)
            BZ2_bzWriteOpen((int *)in_RDI,f,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                            (int)in_stack_ffffffffffffffa8,
                            (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  in_RDI[2]._vptr_Stream = pp_Var1;
  if (*(int *)&in_RDI[2].file_ == 0) {
    Stream::setCompressedIn(in_RDI,0);
    return;
  }
  BZ2_bzWriteClose((int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI,
                   (int)((ulong)f >> 0x20),in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  this_00 = (BagException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  BagException::BagException(this_00,in_stack_ffffffffffffff98);
  __cxa_throw(this_00,&BagException::typeinfo,BagException::~BagException);
}

Assistant:

void BZ2Stream::startWrite() {
    bzfile_ = BZ2_bzWriteOpen(&bzerror_, getFilePointer(), block_size_100k_, verbosity_, work_factor_);

    switch (bzerror_) {
        case BZ_OK: break;
        default: {
            BZ2_bzWriteClose(&bzerror_, bzfile_, 0, NULL, NULL);
            throw BagException("Error opening file for writing compressed stream");
        }
    }

    setCompressedIn(0);
}